

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_record_field_set_real_name(coda_type_record_field *field,char *real_name)

{
  char *pcVar1;
  char *real_name_local;
  coda_type_record_field *field_local;
  
  if (field == (coda_type_record_field *)0x0) {
    coda_set_error(-100,"field argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x414);
    field_local._4_4_ = -1;
  }
  else if (real_name == (char *)0x0) {
    coda_set_error(-100,"real_name argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x419);
    field_local._4_4_ = -1;
  }
  else if (field->real_name == (char *)0x0) {
    pcVar1 = strdup(real_name);
    field->real_name = pcVar1;
    if (field->real_name == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0x425);
      field_local._4_4_ = -1;
    }
    else {
      field_local._4_4_ = 0;
    }
  }
  else {
    coda_set_error(-400,"field already has a real name");
    field_local._4_4_ = -1;
  }
  return field_local._4_4_;
}

Assistant:

int coda_type_record_field_set_real_name(coda_type_record_field *field, const char *real_name)
{
    if (field == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (real_name == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "real_name argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (field->real_name != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "field already has a real name");
        return -1;
    }
    field->real_name = strdup(real_name);
    if (field->real_name == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }

    return 0;
}